

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

size_t __thiscall ktx::ValidationContext::calcImageSize(ValidationContext *this,uint32_t level)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar4 = (this->header).pixelWidth >> ((byte)level & 0x1f);
  uVar2 = (this->header).pixelHeight >> ((byte)level & 0x1f);
  uVar1 = (uint)(this->parsedBlockDimension0).super__Optional_base<unsigned_char,_true,_true>.
                _M_payload.super__Optional_payload_base<unsigned_char>._M_payload._M_value;
  uVar6 = 0;
  if ((this->parsedBlockDimension0).super__Optional_base<unsigned_char,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_char>._M_engaged == false) {
    uVar1 = 0;
  }
  uVar3 = (uint)(this->expectedBlockDimension0).super__Optional_base<unsigned_char,_true,_true>.
                _M_payload.super__Optional_payload_base<unsigned_char>._M_payload._M_value;
  if ((this->expectedBlockDimension0).super__Optional_base<unsigned_char,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_char>._M_engaged == false) {
    uVar3 = uVar1;
  }
  uVar1 = 0;
  if ((this->parsedBlockDimension1).super__Optional_base<unsigned_char,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_char>._M_engaged != false) {
    uVar1._0_2_ = this->parsedBlockDimension1;
    uVar1._2_2_ = this->parsedBlockDimension2;
  }
  uVar5 = (uint)(this->expectedBlockDimension1).super__Optional_base<unsigned_char,_true,_true>.
                _M_payload.super__Optional_payload_base<unsigned_char>._M_payload._M_value;
  if ((this->expectedBlockDimension1).super__Optional_base<unsigned_char,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_char>._M_engaged == false) {
    uVar5 = uVar1;
  }
  uVar1 = ceil_div<unsigned_int>(uVar4 + (uVar4 == 0),uVar3 + 1);
  uVar2 = ceil_div<unsigned_int>(uVar2 + (uVar2 == 0),(uVar5 & 0xff) + 1);
  if (((this->parsedBlockByteLength).super__Optional_base<unsigned_char,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_char>._M_engaged & 1U) != 0) {
    uVar6._0_2_ = this->parsedBlockByteLength;
    uVar6._2_2_ = this->parsedBlockDimension0;
  }
  if ((this->expectedBytePlanes).super__Optional_base<std::array<unsigned_char,_8UL>,_true,_true>.
      _M_payload.super__Optional_payload_base<std::array<unsigned_char,_8UL>_>._M_engaged != false)
  {
    uVar6 = *(uint *)&(this->expectedBytePlanes).
                      super__Optional_base<std::array<unsigned_char,_8UL>,_true,_true>._M_payload.
                      super__Optional_payload_base<std::array<unsigned_char,_8UL>_>._M_payload;
  }
  return (ulong)((uVar6 & 0xff) * uVar2 * uVar1);
}

Assistant:

size_t ValidationContext::calcImageSize(uint32_t level) {
    const auto levelWidth = std::max(1u, header.pixelWidth >> level);
    const auto levelHeight = std::max(1u, header.pixelHeight >> level);
    const auto blockDimensionX = 1u + expectedBlockDimension0.value_or(parsedBlockDimension0.value_or(0u));
    const auto blockDimensionY = 1u + expectedBlockDimension1.value_or(parsedBlockDimension1.value_or(0u));
    const auto blockCountX = ceil_div(levelWidth, blockDimensionX);
    const auto blockCountY = ceil_div(levelHeight, blockDimensionY);
    const auto blockSize = expectedBytePlanes ?
            expectedBytePlanes->at(0) :
            parsedBlockByteLength.value_or(0u);

    return blockCountX * blockCountY * blockSize;
}